

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O3

int ImStb::stb_text_locate_coord(ImGuiInputTextState *str,float x,float y)

{
  ImWchar *text_begin;
  ushort uVar1;
  uint uVar2;
  unsigned_short *puVar3;
  ImFont *pIVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  float *pfVar8;
  undefined8 in_R8;
  int iVar9;
  ImVec2 IVar10;
  float fVar11;
  float fVar12;
  ImWchar *local_30;
  
  uVar2 = str->CurLenW;
  uVar7 = (ulong)uVar2;
  if (0 < (int)uVar2) {
    fVar12 = 0.0;
    uVar6 = 0;
    do {
      puVar3 = (str->TextW).Data;
      local_30 = (ImWchar *)0x0;
      iVar9 = (int)uVar6;
      text_begin = puVar3 + iVar9;
      IVar10 = InputTextCalcTextSizeW
                         (text_begin,puVar3 + str->CurLenW,&local_30,(ImVec2 *)0x1,SUB81(in_R8,0));
      uVar5 = (uint)((ulong)((long)local_30 - (long)text_begin) >> 1);
      if ((int)uVar5 < 1) break;
      if ((y < fVar12) && (iVar9 == 0)) {
        uVar7 = 0;
        break;
      }
      fVar12 = fVar12 + IVar10.y;
      if (y < fVar12) {
        uVar7 = uVar6;
        if (0.0 <= x) {
          puVar3 = (str->TextW).Data;
          if (IVar10.x <= x) goto LAB_00196dc1;
          uVar7 = (ulong)(uVar5 & 0x7fffffff);
          fVar12 = 0.0;
          goto LAB_00196d6c;
        }
        break;
      }
      uVar6 = (ulong)(iVar9 + uVar5);
    } while ((int)(iVar9 + uVar5) < (int)uVar2);
  }
  goto LAB_00196dd6;
  while( true ) {
    uVar6 = uVar6 + 1;
    uVar7 = uVar7 - 1;
    fVar12 = fVar12 + fVar11;
    if (uVar7 == 0) break;
LAB_00196d6c:
    uVar1 = puVar3[uVar6];
    fVar11 = -1.0;
    if (uVar1 != 10) {
      pIVar4 = GImGui->Font;
      pfVar8 = &pIVar4->FallbackAdvanceX;
      if ((int)(uint)uVar1 < (pIVar4->IndexAdvanceX).Size) {
        pfVar8 = (float *)((ulong)((uint)uVar1 * 4) + (long)(pIVar4->IndexAdvanceX).Data);
      }
      fVar11 = (GImGui->FontSize / pIVar4->FontSize) * *pfVar8;
    }
    if (x < fVar12 + fVar11) {
      uVar7 = uVar6;
      if (fVar12 + fVar11 * 0.5 <= x) {
        uVar7 = (ulong)((int)uVar6 + 1);
      }
      goto LAB_00196dd6;
    }
  }
LAB_00196dc1:
  uVar7 = (ulong)(uVar5 + iVar9);
  if (puVar3[(long)(int)(uVar5 + iVar9) + -1] == 10) {
    uVar7 = (ulong)((uVar5 + iVar9) - 1);
  }
LAB_00196dd6:
  return (int)uVar7;
}

Assistant:

static int stb_text_locate_coord(STB_TEXTEDIT_STRING *str, float x, float y)
{
   StbTexteditRow r;
   int n = STB_TEXTEDIT_STRINGLEN(str);
   float base_y = 0, prev_x;
   int i=0, k;

   r.x0 = r.x1 = 0;
   r.ymin = r.ymax = 0;
   r.num_chars = 0;

   // search rows to find one that straddles 'y'
   while (i < n) {
      STB_TEXTEDIT_LAYOUTROW(&r, str, i);
      if (r.num_chars <= 0)
         return n;

      if (i==0 && y < base_y + r.ymin)
         return 0;

      if (y < base_y + r.ymax)
         break;

      i += r.num_chars;
      base_y += r.baseline_y_delta;
   }

   // below all text, return 'after' last character
   if (i >= n)
      return n;

   // check if it's before the beginning of the line
   if (x < r.x0)
      return i;

   // check if it's before the end of the line
   if (x < r.x1) {
      // search characters in row for one that straddles 'x'
      prev_x = r.x0;
      for (k=0; k < r.num_chars; ++k) {
         float w = STB_TEXTEDIT_GETWIDTH(str, i, k);
         if (x < prev_x+w) {
            if (x < prev_x+w/2)
               return k+i;
            else
               return k+i+1;
         }
         prev_x += w;
      }
      // shouldn't happen, but if it does, fall through to end-of-line case
   }

   // if the last character is a newline, return that. otherwise return 'after' the last character
   if (STB_TEXTEDIT_GETCHAR(str, i+r.num_chars-1) == STB_TEXTEDIT_NEWLINE)
      return i+r.num_chars-1;
   else
      return i+r.num_chars;
}